

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::checkElemTimeScale
          (Compilation *this,optional<slang::TimeScale> timeScale,SourceRange sourceRange)

{
  pointer puVar1;
  DefinitionSymbol *pDVar2;
  SyntaxNode *pSVar3;
  optional<slang::TimeScale> timeScale_00;
  unsigned_long uVar4;
  unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_> *def;
  pointer puVar5;
  SourceRange SVar6;
  iterator __begin3;
  iterator local_30;
  
  if (((uint5)timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale> & 0x100000000) == 0) {
    if (this->anyElemsWithTimescales != false) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x14000d,sourceRange);
      return;
    }
  }
  else if (this->anyElemsWithTimescales == false) {
    this->anyElemsWithTimescales = true;
    puVar1 = (this->definitionMemory).
             super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (this->definitionMemory).
                  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1)
    {
      pDVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
               .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
      timeScale_00.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale> =
           *(_Optional_base<slang::TimeScale,_true,_true> *)
            &(pDVar2->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>;
      SVar6 = parsing::Token::range
                        ((Token *)&(pDVar2->super_Symbol).originatingSyntax[3].parent[2].parent);
      checkElemTimeScale(this,timeScale_00,SVar6);
    }
    local_30 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
               ::begin(&(this->packageMap).table_);
    while (local_30.p_ != (table_element_pointer)0x0) {
      pSVar3 = ((local_30.p_)->second->super_ValueSymbol).super_Symbol.originatingSyntax;
      if (pSVar3 != (SyntaxNode *)0x0) {
        uVar4 = ((local_30.p_)->second->super_ValueSymbol).driverMap.field_0.rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                .first[0].left;
        SVar6 = parsing::Token::range((Token *)&pSVar3[3].parent[2].parent);
        checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar4,0),SVar6);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment(&local_30);
    }
  }
  return;
}

Assistant:

void Compilation::checkElemTimeScale(std::optional<TimeScale> timeScale, SourceRange sourceRange) {
    if (timeScale) {
        if (anyElemsWithTimescales)
            return;

        anyElemsWithTimescales = true;
        for (auto& def : definitionMemory) {
            auto& syntax = def->getSyntax()->as<ModuleDeclarationSyntax>();
            checkElemTimeScale(def->timeScale, syntax.header->name.range());
        }

        for (auto [name, package] : packageMap) {
            if (auto syntax = package->getSyntax()) {
                checkElemTimeScale(package->timeScale,
                                   syntax->as<ModuleDeclarationSyntax>().header->name.range());
            }
        }
    }
    else if (anyElemsWithTimescales) {
        root->addDiag(diag::MissingTimeScale, sourceRange);
    }
}